

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

CURLcode Curl_base64_decode(char *src,uchar **outptr,size_t *outlen)

{
  char cVar1;
  uchar uVar2;
  CURLcode CVar3;
  size_t sVar4;
  uchar *puVar5;
  long lVar6;
  char *pcVar7;
  size_t padding;
  ulong uVar8;
  long lVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  uchar *puVar15;
  
  *outptr = (uchar *)0x0;
  *outlen = 0;
  sVar4 = strlen(src);
  CVar3 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar4 & 3) == 0 && sVar4 != 0) {
    for (lVar9 = 0; src[lVar9] != '\0'; lVar9 = lVar9 + 1) {
      if (src[lVar9] == '=') {
        lVar6 = (ulong)(src[lVar9 + 1] == '=') + 1;
        goto LAB_00103584;
      }
    }
    lVar6 = 0;
LAB_00103584:
    if (sVar4 - lVar6 == lVar9) {
      uVar13 = sVar4 >> 2;
      sVar14 = uVar13 * 3 - lVar6;
      puVar5 = (uchar *)(*Curl_cmalloc)(sVar14 + 1);
      if (puVar5 == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar9 = 0;
        puVar15 = puVar5;
        do {
          uVar12 = 0;
          lVar6 = 0;
          uVar8 = 0;
          pcVar7 = src;
          do {
            cVar1 = *pcVar7;
            if (cVar1 == '=') {
              uVar12 = uVar12 << 6;
              uVar8 = uVar8 + 1;
            }
            else {
              lVar10 = 0;
              if (cVar1 == 'A') {
                cVar11 = 'A';
              }
              else {
                do {
                  cVar11 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar10 + 1];
                  lVar10 = lVar10 + 1;
                  if (cVar11 == '\0') break;
                } while (cVar11 != cVar1);
              }
              uVar12 = uVar12 * 0x40 + lVar10;
              if (cVar11 != cVar1) {
                lVar6 = 0;
                goto LAB_00103675;
              }
            }
            lVar6 = lVar6 + 1;
            pcVar7 = pcVar7 + 1;
          } while (lVar6 != 4);
          if (uVar8 == 0) {
            uVar2 = curlx_ultouc(uVar12 & 0xff);
            puVar15[2] = uVar2;
          }
          if (uVar8 < 2) {
            uVar2 = curlx_ultouc(uVar12 >> 8 & 0xff);
            puVar15[1] = uVar2;
          }
          uVar2 = curlx_ultouc(uVar12 >> 0x10 & 0xff);
          *puVar15 = uVar2;
          lVar6 = 3 - uVar8;
LAB_00103675:
          if (lVar6 == 0) {
            (*Curl_cfree)(puVar5);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar15 = puVar15 + lVar6;
          src = src + 4;
          lVar9 = lVar9 + 1;
        } while (lVar9 != uVar13 + (uVar13 == 0));
        *puVar15 = '\0';
        *outptr = puVar5;
        *outlen = sVar14;
        CVar3 = CURLE_OK;
      }
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_base64_decode(const char *src,
                            unsigned char **outptr, size_t *outlen)
{
  size_t srclen = 0;
  size_t length = 0;
  size_t padding = 0;
  size_t i;
  size_t numQuantums;
  size_t rawlen = 0;
  unsigned char *pos;
  unsigned char *newstr;

  *outptr = NULL;
  *outlen = 0;
  srclen = strlen(src);

  /* Check the length of the input string is valid */
  if(!srclen || srclen % 4)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Find the position of any = padding characters */
  while((src[length] != '=') && src[length])
    length++;

  /* A maximum of two = padding characters is allowed */
  if(src[length] == '=') {
    padding++;
    if(src[length + 1] == '=')
      padding++;
  }

  /* Check the = padding characters weren't part way through the input */
  if(length + padding != srclen)
    return CURLE_BAD_CONTENT_ENCODING;

  /* Calculate the number of quantums */
  numQuantums = srclen / 4;

  /* Calculate the size of the decoded string */
  rawlen = (numQuantums * 3) - padding;

  /* Allocate our buffer including room for a zero terminator */
  newstr = malloc(rawlen + 1);
  if(!newstr)
    return CURLE_OUT_OF_MEMORY;

  pos = newstr;

  /* Decode the quantums */
  for(i = 0; i < numQuantums; i++) {
    size_t result = decodeQuantum(pos, src);
    if(!result) {
      free(newstr);

      return CURLE_BAD_CONTENT_ENCODING;
    }

    pos += result;
    src += 4;
  }

  /* Zero terminate */
  *pos = '\0';

  /* Return the decoded data */
  *outptr = newstr;
  *outlen = rawlen;

  return CURLE_OK;
}